

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

reference __thiscall
absl::lts_20250127::container_internal::
btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_*>
::operator*(btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_*>
            *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  template_ElementType<3UL> *ptVar4;
  btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *this_00;
  anon_class_1_0_00000001 local_14;
  anon_class_1_0_00000001 local_13;
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  
  this_00 = this->node_;
  if (this_00 ==
      (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
       *)0x0) {
    operator*::anon_class_1_0_00000001::operator()(&local_11);
    this_00 = this->node_;
  }
  iVar1 = this->position_;
  bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::start(this_00);
  if (iVar1 < (int)(uint)bVar2) {
    operator*::anon_class_1_0_00000001::operator()(&local_12);
  }
  iVar1 = this->position_;
  bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::finish(this->node_);
  if ((int)(uint)bVar2 <= iVar1) {
    bVar3 = IsEndIterator(this);
    if (bVar3) {
      operator*::anon_class_1_0_00000001::operator()(&local_13);
    }
    iVar1 = this->position_;
    bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
            ::finish(this->node_);
    if ((int)(uint)bVar2 <= iVar1) {
      operator*::anon_class_1_0_00000001::operator()(&local_14);
    }
  }
  iVar1 = this->position_;
  ptVar4 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
           ::GetField<3ul>((btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
                            *)this->node_);
  return (reference)(ptVar4 + (byte)iVar1);
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    assert_valid_generation(node_);
    ABSL_HARDENING_ASSERT(position_ >= node_->start());
    if (position_ >= node_->finish()) {
      ABSL_HARDENING_ASSERT(!IsEndIterator() && "Dereferencing end() iterator");
      ABSL_HARDENING_ASSERT(position_ < node_->finish());
    }
    return node_->value(static_cast<field_type>(position_));
  }